

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fFboTestCase.cpp
# Opt level: O0

vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
* __thiscall
deqp::gles31::Functional::getEnablingExtensions_abi_cxx11_
          (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *__return_storage_ptr__,Functional *this,deUint32 format,RenderContext *renderContext)

{
  undefined4 in_register_00000014;
  allocator<char> local_d9;
  value_type local_d8;
  allocator<char> local_b1;
  value_type local_b0;
  allocator<char> local_89;
  value_type local_88;
  allocator<char> local_51;
  value_type local_50;
  undefined1 local_2d;
  deUint32 local_2c;
  ContextType local_28;
  byte local_21;
  long *plStack_20;
  bool supportsES32;
  RenderContext *renderContext_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *pvStack_10;
  deUint32 format_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *out;
  
  plStack_20 = (long *)CONCAT44(in_register_00000014,format);
  renderContext_local._4_4_ = (int)this;
  pvStack_10 = __return_storage_ptr__;
  local_28.super_ApiType.m_bits = (ApiType)(**(code **)(*plStack_20 + 0x10))();
  local_2c = (deUint32)glu::ApiType::es(3,2);
  local_21 = glu::contextSupports(local_28,(ApiType)local_2c);
  local_2d = 0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(__return_storage_ptr__);
  if (renderContext_local._4_4_ == 0x822d) {
LAB_007c2f33:
    if ((local_21 & 1) == 0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_b0,"GL_EXT_color_buffer_half_float",&local_b1);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(__return_storage_ptr__,&local_b0);
      std::__cxx11::string::~string((string *)&local_b0);
      std::allocator<char>::~allocator(&local_b1);
    }
  }
  else {
    if (renderContext_local._4_4_ != 0x822e) {
      if (renderContext_local._4_4_ == 0x822f) goto LAB_007c2f33;
      if ((renderContext_local._4_4_ != 0x8230) && (renderContext_local._4_4_ != 0x8814)) {
        if (renderContext_local._4_4_ == 0x8815) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_88,"GL_EXT_color_buffer_float",&local_89);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::push_back(__return_storage_ptr__,&local_88);
          std::__cxx11::string::~string((string *)&local_88);
          std::allocator<char>::~allocator(&local_89);
          return __return_storage_ptr__;
        }
        if (renderContext_local._4_4_ == 0x881a) goto LAB_007c2f33;
        if (renderContext_local._4_4_ == 0x881b) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_50,"GL_EXT_color_buffer_half_float",&local_51);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::push_back(__return_storage_ptr__,&local_50);
          std::__cxx11::string::~string((string *)&local_50);
          std::allocator<char>::~allocator(&local_51);
          return __return_storage_ptr__;
        }
        if (renderContext_local._4_4_ != 0x8c3a) {
          return __return_storage_ptr__;
        }
      }
    }
    if ((local_21 & 1) == 0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_d8,"GL_EXT_color_buffer_float",&local_d9);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(__return_storage_ptr__,&local_d8);
      std::__cxx11::string::~string((string *)&local_d8);
      std::allocator<char>::~allocator(&local_d9);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

static std::vector<std::string> getEnablingExtensions (deUint32 format, glu::RenderContext& renderContext)
{
	const bool					supportsES32 = glu::contextSupports(renderContext.getType(), glu::ApiType::es(3, 2));
	std::vector<std::string>	out;

	DE_ASSERT(!isRequiredFormat(format, renderContext));

	switch (format)
	{
		case GL_RGB16F:
			out.push_back("GL_EXT_color_buffer_half_float");
			break;

		case GL_RGB32F:
			out.push_back("GL_EXT_color_buffer_float");
			break;

		case GL_RGBA16F:
		case GL_RG16F:
		case GL_R16F:
			if (!supportsES32)
				out.push_back("GL_EXT_color_buffer_half_float");
			break;

		case GL_RGBA32F:
		case GL_R11F_G11F_B10F:
		case GL_RG32F:
		case GL_R32F:
			if (!supportsES32)
				out.push_back("GL_EXT_color_buffer_float");
			break;

		default:
			break;
	}

	return out;
}